

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O0

bool DecodeHexBlockHeader(CBlockHeader *header,string *hex_header)

{
  long lVar1;
  string_view hex_str;
  bool bVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  exception *anon_var_0;
  DataStream ser_header;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_data;
  DataStream *in_stack_ffffffffffffff38;
  CBlockHeader *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  string_view in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar2 = IsHex(in_stack_ffffffffffffff60);
  if (bVar2) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    hex_str._M_str._0_7_ = in_stack_ffffffffffffffa8;
    hex_str._M_len = in_RDI;
    hex_str._M_str._7_1_ = in_stack_ffffffffffffffaf;
    ParseHex<unsigned_char>(hex_str);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    DataStream::DataStream
              ((DataStream *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               (Span<const_unsigned_char>)in_stack_ffffffffffffff60);
    DataStream::operator>>
              ((DataStream *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    bVar3 = 1;
    DataStream::~DataStream(in_stack_ffffffffffffff38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  }
  else {
    bVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeHexBlockHeader(CBlockHeader& header, const std::string& hex_header)
{
    if (!IsHex(hex_header)) return false;

    const std::vector<unsigned char> header_data{ParseHex(hex_header)};
    DataStream ser_header{header_data};
    try {
        ser_header >> header;
    } catch (const std::exception&) {
        return false;
    }
    return true;
}